

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

void __thiscall
kratos::Port::Port(Port *this,Generator *module,PortDirection direction,string *name,uint32_t width,
                  uint32_t size,PortType type,bool is_signed)

{
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar1;
  string_view format_str;
  format_args args;
  pointer local_78;
  size_type sStack_70;
  ulong local_68;
  string local_50;
  
  aVar1._1_7_ = 0;
  aVar1._0_1_ = is_signed;
  Var::Var(&this->super_Var,module,name,width,size,is_signed,PortIO);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002bae38;
  this->direction_ = direction;
  this->type_ = type;
  (this->active_high_).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  if (width < 2 || 3 < type - Clock) {
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_78 = (name->_M_dataplus)._M_p;
  sStack_70 = name->_M_string_length;
  local_68 = (ulong)width;
  format_str.size_ = 0x2d;
  format_str.data_ = (char *)0x1d;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = aVar1.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_50,(detail *)"{0}\'s width has be 1, got {1}",format_str,args);
  UserException::UserException(this_00,&local_50);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Port::Port(Generator* module, PortDirection direction, const ::string& name, uint32_t width,
           uint32_t size, PortType type, bool is_signed)
    : Var(module, name, width, size, is_signed, VarType::PortIO),
      direction_(direction),
      type_(type) {
    if ((type == PortType::AsyncReset || type == PortType::Clock || type == PortType::ClockEnable ||
         type == PortType::Reset) &&
        width > 1) {
        throw UserException(::format("{0}'s width has be 1, got {1}", name, width));
    }
}